

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackIFWInstaller.cxx
# Opt level: O2

void __thiscall cmCPackIFWInstaller::GeneratePackageFiles(cmCPackIFWInstaller *this)

{
  bool bVar1;
  char *pcVar2;
  _Base_ptr p_Var3;
  cmCPackIFWPackage package;
  allocator local_219;
  string local_218;
  cmCPackIFWPackage local_1f8;
  
  if (((this->Packages)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) &&
     (bVar1 = cmCPackIFWGenerator::IsOnePackage(this->Generator), !bVar1)) {
    for (p_Var3 = (this->Packages)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var3 != &(this->Packages)._M_t._M_impl.super__Rb_tree_header;
        p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
      cmCPackIFWPackage::GeneratePackageFile(*(cmCPackIFWPackage **)(p_Var3 + 2));
    }
    return;
  }
  cmCPackIFWPackage::cmCPackIFWPackage(&local_1f8);
  local_1f8.Generator = this->Generator;
  local_1f8.Installer = this;
  std::__cxx11::string::string((string *)&local_218,"CPACK_IFW_PACKAGE_GROUP",&local_219);
  pcVar2 = GetOption(this,&local_218);
  std::__cxx11::string::~string((string *)&local_218);
  if (pcVar2 == (char *)0x0) {
    cmCPackIFWPackage::ConfigureFromOptions(&local_1f8);
  }
  else {
    std::__cxx11::string::string((string *)&local_218,pcVar2,&local_219);
    cmCPackIFWPackage::ConfigureFromGroup(&local_1f8,&local_218);
    std::__cxx11::string::~string((string *)&local_218);
    std::__cxx11::string::assign((char *)&local_1f8.ForcedInstallation);
  }
  cmCPackIFWPackage::GeneratePackageFile(&local_1f8);
  cmCPackIFWPackage::~cmCPackIFWPackage(&local_1f8);
  return;
}

Assistant:

void cmCPackIFWInstaller::GeneratePackageFiles()
{
  if (Packages.empty() || Generator->IsOnePackage())
    {
    // Generate default package
    cmCPackIFWPackage package;
    package.Generator = Generator;
    package.Installer = this;
    // Check package group
    if (const char* option = GetOption("CPACK_IFW_PACKAGE_GROUP"))
      {
      package.ConfigureFromGroup(option);
      package.ForcedInstallation = "true";
      }
    else
      {
      package.ConfigureFromOptions();
      }
    package.GeneratePackageFile();
    return;
    }

  // Generate packages meta information
  for(PackagesMap::iterator pit = Packages.begin();
      pit != Packages.end(); ++pit)
    {
    cmCPackIFWPackage* package = pit->second;
    package->GeneratePackageFile();
  }
}